

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_val_t * mpcaf_grammar_id(mpc_val_t *x,void *s)

{
  char *pcVar1;
  mpc_parser_t *pmVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *p;
  
  pmVar2 = mpca_grammar_find_parser((char *)x,(mpca_grammar_st_t *)s);
  free(x);
  pcVar1 = pmVar2->name;
  pmVar3 = (mpc_parser_t *)calloc(1,0x38);
  pmVar3->type = '\0';
  pmVar3->retained = '\0';
  pmVar3->name = (char *)0x0;
  if (pcVar1 == (char *)0x0) {
    pmVar3->type = '\x0f';
    (pmVar3->data).expect.x = pmVar2;
  }
  else {
    pmVar3->type = '\x10';
    (pmVar3->data).expect.x = pmVar2;
    (pmVar3->data).apply.f = mpc_ast_add_tag;
    (pmVar3->data).apply_to.d = pcVar1;
    pmVar2 = (mpc_parser_t *)calloc(1,0x38);
    pmVar2->name = (char *)0x0;
    pmVar2->type = '\x0f';
    pmVar2->retained = '\0';
    (pmVar2->data).expect.x = pmVar3;
    pmVar3 = pmVar2;
  }
  (pmVar3->data).apply.f = mpc_ast_add_root;
  pmVar3 = mpca_state(pmVar3);
  return pmVar3;
}

Assistant:

static mpc_val_t *mpcaf_grammar_id(mpc_val_t *x, void *s) {

  mpca_grammar_st_t *st = s;
  mpc_parser_t *p = mpca_grammar_find_parser(x, st);
  free(x);

  if (p->name) {
    return mpca_state(mpca_root(mpca_add_tag(p, p->name)));
  } else {
    return mpca_state(mpca_root(p));
  }
}